

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  undefined8 in_R8;
  size_t local_50;
  size_t local_48;
  Type local_40;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncInputStream *this_local;
  
  buffer_local = (void *)CONCAT44(in_register_00000034,__fd);
  maxBytes_local = __nbytes;
  minBytes_local = (size_t)__buf;
  this_local = this;
  (**(code **)(*buffer_local + 8))(&local_40,buffer_local,__buf,__nbytes,in_R8);
  local_50 = maxBytes_local;
  local_48 = minBytes_local;
  Promise<unsigned_long>::
  then<kj::AsyncInputStream::read(void*,unsigned_long,unsigned_long)::__0,kj::_::PropagateException>
            ((Promise<unsigned_long> *)this,&local_40,(PropagateException *)&local_50);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_40);
  return (ssize_t)this;
}

Assistant:

Promise<size_t> AsyncInputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  return tryRead(buffer, minBytes, maxBytes).then([=](size_t result) {
    if (result >= minBytes) {
      return result;
    } else {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      // Pretend we read zeros from the input.
      memset(reinterpret_cast<byte*>(buffer) + result, 0, minBytes - result);
      return minBytes;
    }
  });
}